

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

int SortByDominancePreOrder(void *a,void *b)

{
  VmInstruction *a_00;
  VmInstruction *b_00;
  bool bVar1;
  VmInstruction *bInst;
  VmInstruction *aInst;
  void *b_local;
  void *a_local;
  
  a_00 = *a;
  b_00 = *b;
  if (a_00->parent->dominanceGraphPreOrderId < b_00->parent->dominanceGraphPreOrderId) {
    a_local._4_4_ = -1;
  }
  else if (b_00->parent->dominanceGraphPreOrderId < a_00->parent->dominanceGraphPreOrderId) {
    a_local._4_4_ = 1;
  }
  else {
    bVar1 = IsAfter(a_00,b_00);
    if (bVar1) {
      a_local._4_4_ = 1;
    }
    else {
      bVar1 = IsAfter(b_00,a_00);
      if (bVar1) {
        a_local._4_4_ = -1;
      }
      else {
        a_local._4_4_ = 0;
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

int SortByDominancePreOrder(const void* a, const void* b)
{
	VmInstruction *aInst = *(VmInstruction**)a;
	VmInstruction *bInst = *(VmInstruction**)b;

	if(aInst->parent->dominanceGraphPreOrderId < bInst->parent->dominanceGraphPreOrderId)
		return -1;

	if(aInst->parent->dominanceGraphPreOrderId > bInst->parent->dominanceGraphPreOrderId)
		return 1;

	if(IsAfter(aInst, bInst))
		return 1;

	if(IsAfter(bInst, aInst))
		return -1;

	return 0;
}